

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O1

void Abc_AigRehash(Abc_Aig_t *pMan)

{
  size_t __size;
  int iVar1;
  int *piVar2;
  void **ppvVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  uint uVar7;
  Abc_Obj_t **__s;
  Abc_Obj_t *pAVar8;
  long lVar9;
  int iVar10;
  Abc_Obj_t *pAVar11;
  Abc_Obj_t *pAVar12;
  uint uVar13;
  
  iVar1 = pMan->nBins;
  __size = (long)iVar1 * 8;
  __s = (Abc_Obj_t **)malloc(__size);
  iVar10 = 0;
  memset(__s,0,__size);
  if (0 < (long)iVar1) {
    lVar9 = 0;
    iVar10 = 0;
    do {
      pAVar12 = pMan->pBins[lVar9];
      if (pAVar12 != (Abc_Obj_t *)0x0) {
        pAVar8 = pAVar12->pNext;
        do {
          pAVar11 = pAVar8;
          piVar2 = (pAVar12->vFanins).pArray;
          iVar1 = *piVar2;
          if (piVar2[1] < iVar1) {
            *piVar2 = piVar2[1];
            piVar2[1] = iVar1;
            uVar13 = *(uint *)&pAVar12->field_0x14;
            *(uint *)&pAVar12->field_0x14 =
                 (uVar13 & 0xfffff3ff | uVar13 >> 1 & 0x400) + (uVar13 & 0x400) * 2;
          }
          ppvVar3 = pAVar12->pNtk->vObjs->pArray;
          piVar2 = (pAVar12->vFanins).pArray;
          pvVar4 = ppvVar3[*piVar2];
          pvVar5 = ppvVar3[piVar2[1]];
          uVar13 = 0;
          if ((((uint)pvVar4 ^ *(uint *)&pAVar12->field_0x14 >> 10) & 1) != 0) {
            uVar13 = 0x38f;
          }
          uVar7 = 0;
          if (((*(uint *)&pAVar12->field_0x14 >> 0xb ^ (uint)pvVar5) & 1) != 0) {
            uVar7 = 0x161;
          }
          uVar6 = (ulong)(uVar7 ^ uVar13 ^
                          *(int *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 0x10) * 0x1f01 ^
                         *(int *)(((ulong)pvVar5 & 0xfffffffffffffffe) + 0x10) * 0xb9b) %
                  (ulong)(uint)pMan->nBins;
          pAVar12->pNext = __s[uVar6];
          __s[uVar6] = pAVar12;
          if (pAVar11 == (Abc_Obj_t *)0x0) {
            pAVar8 = (Abc_Obj_t *)0x0;
          }
          else {
            pAVar8 = pAVar11->pNext;
          }
          iVar10 = iVar10 + 1;
          pAVar12 = pAVar11;
        } while (pAVar11 != (Abc_Obj_t *)0x0);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pMan->nBins);
  }
  if (iVar10 == pMan->nEntries) {
    if (pMan->pBins != (Abc_Obj_t **)0x0) {
      free(pMan->pBins);
      pMan->pBins = (Abc_Obj_t **)0x0;
    }
    pMan->pBins = __s;
    return;
  }
  __assert_fail("Counter == pMan->nEntries",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                ,0x295,"void Abc_AigRehash(Abc_Aig_t *)");
}

Assistant:

void Abc_AigRehash( Abc_Aig_t * pMan )
{
    Abc_Obj_t ** pBinsNew;
    Abc_Obj_t * pEnt, * pEnt2;
    int * pArray;
    unsigned Key;
    int Counter, Temp, i;

    // allocate a new array
    pBinsNew = ABC_ALLOC( Abc_Obj_t *, pMan->nBins );
    memset( pBinsNew, 0, sizeof(Abc_Obj_t *) * pMan->nBins );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < pMan->nBins; i++ )
        Abc_AigBinForEachEntrySafe( pMan->pBins[i], pEnt, pEnt2 )
        {
            // swap the fanins if needed
            pArray = pEnt->vFanins.pArray;
            if ( pArray[0] > pArray[1] )
            {
                Temp = pArray[0];
                pArray[0] = pArray[1];
                pArray[1] = Temp;
                Temp = pEnt->fCompl0;
                pEnt->fCompl0 = pEnt->fCompl1;
                pEnt->fCompl1 = Temp;
            }
            // rehash the node
            Key = Abc_HashKey2( Abc_ObjChild0(pEnt), Abc_ObjChild1(pEnt), pMan->nBins );
            pEnt->pNext   = pBinsNew[Key];
            pBinsNew[Key] = pEnt;
            Counter++;
        }
    assert( Counter == pMan->nEntries );
    // replace the table and the parameters
    ABC_FREE( pMan->pBins );
    pMan->pBins = pBinsNew;
}